

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaTargetGenerator::WriteTargetDependInfo(cmNinjaTargetGenerator *this,string *lang)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *pcVar2;
  cmLocalNinjaGenerator *this_00;
  int iVar3;
  Value *pVVar4;
  long *plVar5;
  string *psVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  pointer path;
  pointer pbVar8;
  string tdin;
  Value tdi;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linked;
  cmGeneratedFileStream tdif;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  string *local_498;
  Value local_490;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_468;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_448;
  Value local_430;
  Value local_408;
  Value local_3e0;
  Value local_3b8;
  Value local_390;
  Value local_368;
  Value local_340;
  Value local_318;
  Value local_2f0;
  Value local_2c8;
  Value local_2a0;
  ValueHolder local_278;
  long local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268 [35];
  
  Json::Value::Value(&local_490,objectValue);
  local_498 = lang;
  Json::Value::Value(&local_2a0,lang);
  pVVar4 = Json::Value::operator[](&local_490,"language");
  Json::Value::operator=(pVVar4,&local_2a0);
  Json::Value::~Value(&local_2a0);
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  std::operator+(&local_4b8,"CMAKE_",local_498);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_4b8);
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar7) {
    local_268[0]._0_8_ = paVar7->_M_allocated_capacity;
    local_268[0]._8_8_ = plVar5[3];
    local_278.string_ = (char *)local_268;
  }
  else {
    local_268[0]._0_8_ = paVar7->_M_allocated_capacity;
    local_278.string_ = ((char *)*plVar5).string_;
  }
  local_270 = plVar5[1];
  *plVar5 = (long)paVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  psVar6 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_278);
  Json::Value::Value(&local_2c8,psVar6);
  pVVar4 = Json::Value::operator[](&local_490,"compiler-id");
  Json::Value::operator=(pVVar4,&local_2c8);
  Json::Value::~Value(&local_2c8);
  if (local_278 != local_268) {
    operator_delete(local_278.string_,local_268[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  iVar3 = std::__cxx11::string::compare((char *)local_498);
  if (iVar3 == 0) {
    pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    psVar6 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).Makefile);
    cmGeneratorTarget::GetFortranModuleDirectory((string *)&local_278,pcVar2,psVar6);
    if (local_270 == 0) {
      cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                ((this->super_cmCommonTargetGenerator).Makefile);
      std::__cxx11::string::_M_assign((string *)&local_278.bool_);
    }
    Json::Value::Value(&local_2f0,(string *)&local_278);
    pVVar4 = Json::Value::operator[](&local_490,"module-dir");
    Json::Value::operator=(pVVar4,&local_2f0);
    Json::Value::~Value(&local_2f0);
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4b8,"CMAKE_Fortran_SUBMODULE_SEP","");
    psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&local_4b8);
    Json::Value::Value(&local_318,psVar6);
    pVVar4 = Json::Value::operator[](&local_490,"submodule-sep");
    Json::Value::operator=(pVVar4,&local_318);
    Json::Value::~Value(&local_318);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
      operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
    }
    pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
    local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4b8,"CMAKE_Fortran_SUBMODULE_EXT","");
    psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&local_4b8);
    Json::Value::Value(&local_340,psVar6);
    pVVar4 = Json::Value::operator[](&local_490,"submodule-ext");
    Json::Value::operator=(pVVar4,&local_340);
    Json::Value::~Value(&local_340);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
      operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
    }
    if (local_278 != local_268) {
      operator_delete(local_278.string_,local_268[0]._M_allocated_capacity + 1);
    }
  }
  psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_368,psVar6);
  pVVar4 = Json::Value::operator[](&local_490,"dir-cur-bld");
  Json::Value::operator=(pVVar4,&local_368);
  Json::Value::~Value(&local_368);
  psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_390,psVar6);
  pVVar4 = Json::Value::operator[](&local_490,"dir-cur-src");
  Json::Value::operator=(pVVar4,&local_390);
  Json::Value::~Value(&local_390);
  psVar6 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_3b8,psVar6);
  pVVar4 = Json::Value::operator[](&local_490,"dir-top-bld");
  Json::Value::operator=(pVVar4,&local_3b8);
  Json::Value::~Value(&local_3b8);
  psVar6 = cmMakefile::GetHomeDirectory_abi_cxx11_((this->super_cmCommonTargetGenerator).Makefile);
  Json::Value::Value(&local_3e0,psVar6);
  pVVar4 = Json::Value::operator[](&local_490,"dir-top-src");
  Json::Value::operator=(pVVar4,&local_3e0);
  Json::Value::~Value(&local_3e0);
  Json::Value::Value(&local_408,arrayValue);
  pVVar4 = Json::Value::operator[](&local_490,"include-dirs");
  pVVar4 = Json::Value::operator=(pVVar4,&local_408);
  Json::Value::~Value(&local_408);
  local_468.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_468.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_468.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  this_00 = this->LocalGenerator;
  psVar6 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator);
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)this_00,&local_468,pcVar2,local_498,psVar6);
  pbVar8 = local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_468.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    path = local_468.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      ConvertToNinjaPath(&local_4b8,this,path);
      Json::Value::Value((Value *)&local_278,&local_4b8);
      Json::Value::append(pVVar4,(Value *)&local_278);
      Json::Value::~Value((Value *)&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
        operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
      }
      path = path + 1;
    } while (path != pbVar8);
  }
  Json::Value::Value(&local_430,arrayValue);
  pVVar4 = Json::Value::operator[](&local_490,"linked-target-dirs");
  pVVar4 = Json::Value::operator=(pVVar4,&local_430);
  Json::Value::~Value(&local_430);
  cmCommonTargetGenerator::GetLinkedTargetDirectories_abi_cxx11_
            (&local_448,&this->super_cmCommonTargetGenerator);
  if (local_448.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_448.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar8 = local_448.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      Json::Value::Value((Value *)&local_278,pbVar8);
      Json::Value::append(pVVar4,(Value *)&local_278);
      Json::Value::~Value((Value *)&local_278);
      pbVar8 = pbVar8 + 1;
    } while (pbVar8 != local_448.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  GetTargetDependInfoPath(&local_4b8,this,local_498);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)&local_278,&local_4b8,false,None);
  Json::operator<<((ostream *)&local_278,&local_490);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_448);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_468);
  Json::Value::~Value(&local_490);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteTargetDependInfo(std::string const& lang)
{
  Json::Value tdi(Json::objectValue);
  tdi["language"] = lang;
  tdi["compiler-id"] =
    this->Makefile->GetSafeDefinition("CMAKE_" + lang + "_COMPILER_ID");

  if (lang == "Fortran") {
    std::string mod_dir = this->GeneratorTarget->GetFortranModuleDirectory(
      this->Makefile->GetHomeOutputDirectory());
    if (mod_dir.empty()) {
      mod_dir = this->Makefile->GetCurrentBinaryDirectory();
    }
    tdi["module-dir"] = mod_dir;
    tdi["submodule-sep"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_SEP");
    tdi["submodule-ext"] =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_SUBMODULE_EXT");
  }

  tdi["dir-cur-bld"] = this->Makefile->GetCurrentBinaryDirectory();
  tdi["dir-cur-src"] = this->Makefile->GetCurrentSourceDirectory();
  tdi["dir-top-bld"] = this->Makefile->GetHomeOutputDirectory();
  tdi["dir-top-src"] = this->Makefile->GetHomeDirectory();

  Json::Value& tdi_include_dirs = tdi["include-dirs"] = Json::arrayValue;
  std::vector<std::string> includes;
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              lang, this->GetConfigName());
  for (std::string const& i : includes) {
    // Convert the include directories the same way we do for -I flags.
    // See upstream ninja issue 1251.
    tdi_include_dirs.append(this->ConvertToNinjaPath(i));
  }

  Json::Value& tdi_linked_target_dirs = tdi["linked-target-dirs"] =
    Json::arrayValue;
  std::vector<std::string> linked = this->GetLinkedTargetDirectories();
  for (std::string const& l : linked) {
    tdi_linked_target_dirs.append(l);
  }

  std::string const tdin = this->GetTargetDependInfoPath(lang);
  cmGeneratedFileStream tdif(tdin);
  tdif << tdi;
}